

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O1

int __thiscall SkipList::remove(SkipList *this,char *__filename)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Node *pNVar3;
  pointer pcVar4;
  _Elt_pointer ppNVar5;
  Node *pNVar6;
  int iVar7;
  undefined8 unaff_RBP;
  stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_> path;
  Node *local_80;
  _Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_> local_78;
  
  local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::_M_initialize_map
            (&local_78,0);
  local_80 = this->head;
  if (local_80 != (Node *)0x0) {
    do {
      pNVar3 = local_80->right;
      while ((pNVar6 = pNVar3, pNVar6 != (Node *)0x0 && ((char *)pNVar6->key < __filename))) {
        local_80 = pNVar6;
        pNVar3 = pNVar6->right;
      }
      if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_78._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<SkipList::Node*,std::allocator<SkipList::Node*>>::
        _M_push_back_aux<SkipList::Node*const&>
                  ((deque<SkipList::Node*,std::allocator<SkipList::Node*>> *)&local_78,&local_80);
      }
      else {
        *local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = local_80;
        local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      local_80 = local_80->down;
    } while (local_80 != (Node *)0x0);
  }
  ppNVar5 = local_78._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_78._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppNVar5 = local_78._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_80 = ppNVar5[-1]->right;
  if ((local_80 == (Node *)0x0) || ((char *)local_80->key != __filename)) {
    iVar7 = 0;
  }
  else {
    this->length = this->length - 1;
    psVar1 = &(local_80->value)._M_string_length;
    if (this->valueSize < *psVar1) {
      __assert_fail("valueSize >= p->value.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/SkipList.cpp"
                    ,0x54,"bool SkipList::remove(uint64_t)");
    }
    this->valueSize = this->valueSize - *psVar1;
    iVar7 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_78._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_78._M_impl.super__Deque_impl_data._M_finish._M_first) {
          local_80 = local_78._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
          operator_delete(local_78._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
          local_78._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_78._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_78._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_78._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
          local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_78._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
          local_78._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_78._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_80 = local_78._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
          local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        pNVar3 = local_80->right;
        if ((pNVar3 == (Node *)0x0) || ((char *)pNVar3->key != __filename)) break;
        local_80->right = pNVar3->right;
        pcVar4 = (pNVar3->value)._M_dataplus._M_p;
        paVar2 = &(pNVar3->value).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar2) {
          operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
        }
        operator_delete(pNVar3,0x38);
      } while (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_78._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
  }
  std::_Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::~_Deque_base(&local_78);
  return iVar7;
}

Assistant:

bool SkipList::remove(uint64_t key) {
  // search the key
  stack<Node *> path;
  Node *p = head;
  while (p) {
    while (p->right && p->right->key < key) p = p->right;
    path.push(p);
    p = p->down;
  }

  // Does the key exist?
  p = path.top()->right;
  if (!p || p->key != key) return false;

  length--;
  assert(valueSize >= p->value.size());
  valueSize -= p->value.size();
  // remove the tower
  while (!path.empty()) {
    p = path.top();
    path.pop();
    Node *t = p->right;
    if (!t || t->key != key) return true;
    p->right = t->right;
    delete t;
  }
  return true;
}